

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O0

int Abc_SopCheck(char *pSop,int nFanins)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  int fFound1;
  int fFound0;
  char *pCubesOld;
  char *pCubes;
  int nFanins_local;
  char *pSop_local;
  
  bVar1 = false;
  bVar2 = false;
  pCubesOld = pSop;
  while( true ) {
    pcVar3 = pCubesOld;
    if (*pCubesOld == '\0') {
      if ((bVar1) && (bVar2)) {
        fprintf(_stdout,"Abc_SopCheck: SOP has cubes in both phases.\n");
        pSop_local._4_4_ = 0;
      }
      else {
        pSop_local._4_4_ = 1;
      }
      return pSop_local._4_4_;
    }
    for (; *pCubesOld != ' '; pCubesOld = pCubesOld + 1) {
    }
    if ((long)pCubesOld - (long)pcVar3 != (long)nFanins) break;
    pcVar3 = pCubesOld + 1;
    if (*pcVar3 == '0') {
      bVar1 = true;
    }
    else if (*pcVar3 == '1') {
      bVar2 = true;
    }
    else if ((*pcVar3 != 'x') && (*pcVar3 != 'n')) {
      fprintf(_stdout,
              "Abc_SopCheck: SOP has a strange character (%c) in the output part of its cube.\n",
              (ulong)(uint)(int)*pcVar3);
      return 0;
    }
    if (pCubesOld[2] != '\n') {
      fprintf(_stdout,"Abc_SopCheck: SOP has a cube without new line in the end.\n");
      return 0;
    }
    pCubesOld = pCubesOld + 3;
  }
  fprintf(_stdout,
          "Abc_SopCheck: SOP has a mismatch between its cover size (%d) and its fanin number (%d).\n"
          ,(ulong)(uint)((int)pCubesOld - (int)pcVar3),(ulong)(uint)nFanins);
  return 0;
}

Assistant:

int Abc_SopCheck( char * pSop, int nFanins )
{
    char * pCubes, * pCubesOld;
    int fFound0 = 0, fFound1 = 0;

    // check the logic function of the node
    for ( pCubes = pSop; *pCubes; pCubes++ )
    {
        // get the end of the next cube
        for ( pCubesOld = pCubes; *pCubes != ' '; pCubes++ );
        // compare the distance
        if ( pCubes - pCubesOld != nFanins )
        {
            fprintf( stdout, "Abc_SopCheck: SOP has a mismatch between its cover size (%d) and its fanin number (%d).\n",
                (int)(ABC_PTRDIFF_T)(pCubes - pCubesOld), nFanins );
            return 0;
        }
        // check the output values for this cube
        pCubes++;
        if ( *pCubes == '0' )
            fFound0 = 1;
        else if ( *pCubes == '1' )
            fFound1 = 1;
        else if ( *pCubes != 'x' && *pCubes != 'n' )
        {
            fprintf( stdout, "Abc_SopCheck: SOP has a strange character (%c) in the output part of its cube.\n", *pCubes );
            return 0;
        }
        // check the last symbol (new line)
        pCubes++;
        if ( *pCubes != '\n' )
        {
            fprintf( stdout, "Abc_SopCheck: SOP has a cube without new line in the end.\n" );
            return 0;
        }
    }
    if ( fFound0 && fFound1 )
    {
        fprintf( stdout, "Abc_SopCheck: SOP has cubes in both phases.\n" );
        return 0;
    }
    return 1;
}